

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Elf.cpp
# Opt level: O0

void * elf::Open(char *filename)

{
  FILE *__stream;
  size_t __size;
  size_t sVar1;
  void *elf_data;
  off_t elf_len;
  FILE *fp;
  char *filename_local;
  
  if (filename == (char *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      filename_local = (char *)0x0;
    }
    else {
      fseeko(__stream,0,2);
      __size = ftello(__stream);
      rewind(__stream);
      if (__size == 0) {
        fclose(__stream);
        filename_local = (char *)0x0;
      }
      else {
        filename_local = (char *)malloc(__size);
        sVar1 = fread(filename_local,1,__size,__stream);
        if (sVar1 == __size) {
          fclose(__stream);
        }
        else {
          fclose(__stream);
          filename_local = (char *)0x0;
        }
      }
    }
  }
  return filename_local;
}

Assistant:

void* elf::Open(const char* filename) {
    if(filename == NULL)
        return NULL;

    FILE* fp = fopen(filename, "r");

    if(!fp) {
        return NULL;
    }

    fseeko(fp, 0, SEEK_END);
    off_t elf_len = ftello(fp);
    rewind(fp);

    if(elf_len == 0) {
        fclose(fp);
        return NULL;
    }

    void* elf_data = malloc((size_t) elf_len);

    if(fread(elf_data, 1, (size_t) elf_len, fp) != elf_len) {
        fclose(fp);
        return NULL;
    }

    fclose(fp);

    return elf_data;
}